

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::print(QTextDocument *this,QPagedPaintDevice *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTextDocumentPrivate *pQVar6;
  QPaintDevice *pQVar7;
  qreal *pqVar8;
  QAbstractTextDocumentLayoutPrivate *pQVar9;
  int *piVar10;
  ulong uVar11;
  undefined8 in_RCX;
  undefined8 uVar12;
  void *__child_stack;
  long *in_RSI;
  QTextDocument *in_RDI;
  void *in_R8;
  long in_FS_OFFSET;
  qreal qVar13;
  double dVar14;
  double dVar15;
  qreal qVar16;
  QFontMetrics *this_00;
  int page;
  int dpiy;
  int verticalMargin;
  int horizontalMargin;
  QAbstractTextDocumentLayout *layout;
  QPaintDevice *dev;
  qreal dpiScaleY;
  qreal dpiScaleX;
  qreal sourceDpiY;
  qreal sourceDpiX;
  QTextDocument *doc;
  bool documentPaginated;
  QTextDocumentPrivate *d;
  int toPage;
  int fromPage;
  QPageRanges pageRanges;
  QSizeF printerPageSize;
  QSizeF scaledPageSize;
  QPointF pageNumberPos;
  QRectF body;
  QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_> clonedDoc;
  QPainter p;
  QMarginsF m;
  QTextFrameFormat fmt;
  QTextBlock dstBlock;
  QTextBlock srcBlock;
  QPagedPaintDevice *in_stack_fffffffffffffd98;
  QTextBlock *in_stack_fffffffffffffda0;
  QPaintDevice *in_stack_fffffffffffffda8;
  QRectF *this_01;
  QRectF *in_stack_fffffffffffffdb0;
  QFont *in_stack_fffffffffffffdb8;
  QTextDocument *in_stack_fffffffffffffdc0;
  bool local_221;
  QPointF *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  bool bVar17;
  undefined1 uVar18;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe2c;
  int local_178 [3];
  int local_16c;
  undefined1 *local_168;
  QSizeF local_160;
  QPointF local_148;
  QRectF local_138;
  QSizeF local_100;
  QSizeF local_f0;
  QPointF local_e0;
  QPointF local_d0;
  QRectF local_c0;
  QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_> local_a0;
  undefined1 *local_98;
  QMarginsF local_88;
  undefined1 *local_58;
  undefined1 *local_50;
  QTextBlock local_48;
  QTextBlock local_38;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QTextDocument *)0x7ae2f1);
  if (in_RSI != (long *)0x0) {
    bVar1 = QSizeF::isValid(&pQVar6->pageSize);
    uVar12 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
    iVar5 = (int)uVar12;
    bVar17 = false;
    if (bVar1) {
      bVar1 = QSizeF::isNull((QSizeF *)in_stack_fffffffffffffda0);
      uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),bVar1);
      iVar5 = (int)uVar12;
      bVar17 = false;
      if (!bVar1) {
        qVar13 = QSizeF::height(&pQVar6->pageSize);
        bVar17 = qVar13 != 2147483647.0;
        iVar5 = (int)CONCAT71((int7)((ulong)uVar12 >> 8),NAN(qVar13));
      }
    }
    local_88.m_left = -NAN;
    local_88.m_top = -NAN;
    local_88.m_right = -NAN;
    local_88.m_bottom = -NAN;
    uVar18 = bVar17;
    QPagedPaintDevice::pageLayout(in_stack_fffffffffffffd98);
    QPageLayout::margins
              ((QPageLayout *)in_stack_fffffffffffffdb0,
               (Unit)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    QPageLayout::~QPageLayout((QPageLayout *)0x7ae3fb);
    if (bVar17 == false) {
      qVar13 = QMarginsF::left(&local_88);
      if ((qVar13 == 0.0) && (!NAN(qVar13))) {
        qVar13 = QMarginsF::right(&local_88);
        if ((qVar13 == 0.0) && (!NAN(qVar13))) {
          qVar13 = QMarginsF::top(&local_88);
          if ((qVar13 == 0.0) && (!NAN(qVar13))) {
            qVar13 = QMarginsF::bottom(&local_88);
            if ((qVar13 == 0.0) && (!NAN(qVar13))) {
              QMarginsF::setLeft(&local_88,2.0);
              QMarginsF::setRight(&local_88,2.0);
              QMarginsF::setTop(&local_88,2.0);
              QMarginsF::setBottom(&local_88,2.0);
              (**(code **)(*in_RSI + 0x60))(in_RSI,&local_88,0);
            }
          }
        }
      }
    }
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    bVar1 = QPainter::isActive((QPainter *)in_stack_fffffffffffffda0);
    if (bVar1) {
      local_a0.d = (QTextDocument *)&DAT_aaaaaaaaaaaaaaaa;
      QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_>::QScopedPointer
                (&local_a0,(QTextDocument *)0x0);
      documentLayout(in_stack_fffffffffffffdc0);
      local_c0.xp = -NAN;
      local_c0.yp = -NAN;
      local_c0.w = -NAN;
      local_c0.h = -NAN;
      QPointF::QPointF(&local_d0,0.0,0.0);
      QRectF::QRectF(in_stack_fffffffffffffdb0,(QPointF *)in_stack_fffffffffffffda8,
                     (QSizeF *)in_stack_fffffffffffffda0);
      local_e0.xp = -NAN;
      local_e0.yp = -NAN;
      QPointF::QPointF(&local_e0);
      iVar2 = qt_defaultDpiX();
      iVar3 = qt_defaultDpiY();
      iVar4 = QPaintDevice::logicalDpiX((QPaintDevice *)0x7ae63e);
      dVar14 = (double)iVar4 / (double)iVar2;
      iVar4 = QPaintDevice::logicalDpiY((QPaintDevice *)0x7ae661);
      dVar15 = (double)iVar4 / (double)iVar3;
      if (bVar17 == false) {
        clone(in_RDI,(__fn *)in_RDI,__child_stack,iVar5,in_R8);
        QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_>::reset
                  ((QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_> *)
                   in_stack_fffffffffffffda0,(QTextDocument *)in_stack_fffffffffffffda8);
        local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        firstBlock((QTextDocument *)in_stack_fffffffffffffdb0);
        local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_>::operator->(&local_a0);
        firstBlock((QTextDocument *)in_stack_fffffffffffffdb0);
        while( true ) {
          bVar17 = QTextBlock::isValid(in_stack_fffffffffffffda0);
          local_221 = false;
          if (bVar17) {
            local_221 = QTextBlock::isValid(in_stack_fffffffffffffda0);
          }
          if (local_221 == false) break;
          QTextBlock::layout((QTextBlock *)in_stack_fffffffffffffda8);
          QTextBlock::layout((QTextBlock *)in_stack_fffffffffffffda8);
          QTextLayout::formats((QTextLayout *)in_stack_fffffffffffffd98);
          QTextLayout::setFormats
                    ((QTextLayout *)in_stack_fffffffffffffdb0,
                     (QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffda8);
          QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x7ae98c);
          QTextBlock::next((QTextBlock *)in_stack_fffffffffffffdb8);
          QTextBlock::operator=((QTextBlock *)local_18,&local_38);
          QTextBlock::next((QTextBlock *)in_stack_fffffffffffffdb8);
          QTextBlock::operator=((QTextBlock *)local_28,&local_48);
        }
        in_stack_fffffffffffffda0 = (QTextBlock *)documentLayout(in_stack_fffffffffffffdc0);
        QPainter::device((QPainter *)in_stack_fffffffffffffda8);
        QAbstractTextDocumentLayout::setPaintDevice
                  ((QAbstractTextDocumentLayout *)in_stack_fffffffffffffda0,
                   &in_stack_fffffffffffffd98->super_QPaintDevice);
        documentLayout(in_stack_fffffffffffffdc0);
        pQVar9 = QAbstractTextDocumentLayout::d_func((QAbstractTextDocumentLayout *)0x7aea36);
        this_01 = (QRectF *)&pQVar9->handlers;
        QAbstractTextDocumentLayout::d_func((QAbstractTextDocumentLayout *)0x7aea4c);
        QHash<int,_QTextObjectHandler>::operator=
                  ((QHash<int,_QTextObjectHandler> *)in_stack_fffffffffffffdb0,
                   (QHash<int,_QTextObjectHandler> *)this_01);
        in_stack_fffffffffffffe2c = (int)((double)iVar2 * 0.7874015748031495);
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        rootFrame((QTextDocument *)in_stack_fffffffffffffda0);
        QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffffdb0);
        QTextFrameFormat::setLeftMargin
                  ((QTextFrameFormat *)this_01,(qreal)in_stack_fffffffffffffda0);
        QTextFrameFormat::setRightMargin
                  ((QTextFrameFormat *)this_01,(qreal)in_stack_fffffffffffffda0);
        QTextFrameFormat::setTopMargin((QTextFrameFormat *)this_01,(qreal)in_stack_fffffffffffffda0)
        ;
        QTextFrameFormat::setBottomMargin
                  ((QTextFrameFormat *)this_01,(qreal)in_stack_fffffffffffffda0);
        rootFrame((QTextDocument *)in_stack_fffffffffffffda0);
        QTextFrame::setFrameFormat
                  ((QTextFrame *)in_stack_fffffffffffffda0,
                   (QTextFrameFormat *)in_stack_fffffffffffffd98);
        QPainter::device((QPainter *)this_01);
        in_stack_fffffffffffffe24 = QPaintDevice::logicalDpiY((QPaintDevice *)0x7aeb5a);
        iVar5 = QPaintDevice::width((QPaintDevice *)0x7aeb6e);
        in_stack_fffffffffffffdb0 = (QRectF *)(double)iVar5;
        iVar5 = QPaintDevice::height((QPaintDevice *)0x7aeb85);
        QRectF::QRectF(&local_138,0.0,0.0,(qreal)in_stack_fffffffffffffdb0,(double)iVar5);
        local_c0.xp = local_138.xp;
        local_c0.yp = local_138.yp;
        local_c0.w = local_138.w;
        local_c0.h = local_138.h;
        qVar13 = QRectF::width(&local_c0);
        this_00 = (QFontMetrics *)(-(double)in_stack_fffffffffffffe2c * dVar14 + qVar13);
        qVar13 = QRectF::height(&local_c0);
        in_stack_fffffffffffffdb8 =
             (QFont *)(-(double)(int)((double)iVar3 * 0.7874015748031495) * dVar15 + qVar13);
        defaultFont((QTextDocument *)this_01);
        QPainter::device((QPainter *)this_01);
        QFontMetrics::QFontMetrics
                  (this_00,in_stack_fffffffffffffdb8,(QPaintDevice *)in_stack_fffffffffffffdb0);
        iVar5 = QFontMetrics::ascent((QFontMetrics *)in_stack_fffffffffffffda0);
        QPointF::QPointF(&local_148,(qreal)this_00,
                         (double)in_stack_fffffffffffffdb8 + (double)iVar5 +
                         (double)(in_stack_fffffffffffffe24 * 5) / 72.0);
        local_e0.xp = local_148.xp;
        local_e0.yp = local_148.yp;
        QFontMetrics::~QFontMetrics((QFontMetrics *)0x7aed21);
        QFont::~QFont((QFont *)0x7aed2e);
        QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_>::operator->(&local_a0);
        local_160 = QRectF::size(this_01);
        setPageSize((QTextDocument *)in_stack_fffffffffffffdb0,(QSizeF *)this_01);
        QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7aed7e);
      }
      else {
        documentLayout(in_stack_fffffffffffffdc0);
        pQVar7 = QAbstractTextDocumentLayout::paintDevice
                           ((QAbstractTextDocumentLayout *)in_stack_fffffffffffffda0);
        if (pQVar7 != (QPaintDevice *)0x0) {
          QPaintDevice::logicalDpiX((QPaintDevice *)0x7ae6ba);
          QPaintDevice::logicalDpiY((QPaintDevice *)0x7ae6d4);
        }
        QPainter::scale((QPainter *)in_stack_fffffffffffffda8,(qreal)in_stack_fffffffffffffda0,
                        (qreal)in_stack_fffffffffffffd98);
        local_f0.wd = (pQVar6->pageSize).wd;
        local_f0.ht = (pQVar6->pageSize).ht;
        pqVar8 = QSizeF::rwidth(&local_f0);
        *pqVar8 = dVar14 * *pqVar8;
        pqVar8 = QSizeF::rheight(&local_f0);
        *pqVar8 = dVar15 * *pqVar8;
        local_100.wd = -NAN;
        local_100.ht = -NAN;
        iVar5 = QPaintDevice::width((QPaintDevice *)0x7ae7c3);
        iVar2 = QPaintDevice::height((QPaintDevice *)0x7ae7da);
        QSizeF::QSizeF(&local_100,(double)iVar5,(double)iVar2);
        qVar13 = QSizeF::width(&local_100);
        qVar16 = QSizeF::width(&local_f0);
        in_stack_fffffffffffffe08 = (QPointF *)(qVar13 / qVar16);
        QSizeF::height(&local_100);
        QSizeF::height(&local_f0);
        QPainter::scale((QPainter *)in_stack_fffffffffffffda8,(qreal)in_stack_fffffffffffffda0,
                        (qreal)in_stack_fffffffffffffd98);
      }
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      QPagedPaintDevice::pageRanges(in_stack_fffffffffffffd98);
      local_16c = QPageRanges::firstPage((QPageRanges *)in_stack_fffffffffffffd98);
      local_178[2] = QPageRanges::lastPage((QPageRanges *)in_stack_fffffffffffffd98);
      if ((local_16c == 0) && (local_178[2] == 0)) {
        local_16c = 1;
        local_178[2] = pageCount((QTextDocument *)0x7aedf6);
      }
      local_178[1] = 1;
      piVar10 = qMax<int>(local_178 + 1,&local_16c);
      local_16c = *piVar10;
      local_178[0] = pageCount((QTextDocument *)0x7aee33);
      piVar10 = qMin<int>(local_178,local_178 + 2);
      local_178[2] = *piVar10;
      iVar5 = local_16c;
      if (local_16c <= local_178[2]) {
        do {
          bVar17 = QPageRanges::isEmpty((QPageRanges *)in_stack_fffffffffffffda0);
          if ((bVar17) ||
             (bVar17 = QPageRanges::contains
                                 ((QPageRanges *)in_stack_fffffffffffffdb8,
                                  (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20)), bVar17)) {
            printPage(in_stack_fffffffffffffe2c,
                      (QPainter *)CONCAT44(in_stack_fffffffffffffe24,iVar5),in_RDI,
                      (QRectF *)CONCAT17(uVar18,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
                     );
          }
          if (iVar5 == local_178[2]) break;
          iVar5 = iVar5 + 1;
          uVar11 = (**(code **)(*in_RSI + 0x40))();
        } while ((uVar11 & 1) != 0);
      }
      QPageRanges::~QPageRanges((QPageRanges *)0x7aef3e);
      QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_>::~QScopedPointer
                ((QScopedPointer<QTextDocument,_QScopedPointerDeleter<QTextDocument>_> *)
                 in_stack_fffffffffffffda0);
    }
    QPainter::~QPainter((QPainter *)in_stack_fffffffffffffda0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocument::print(QPagedPaintDevice *printer) const
{
    Q_D(const QTextDocument);

    if (!printer)
        return;

    bool documentPaginated = d->pageSize.isValid() && !d->pageSize.isNull()
                             && d->pageSize.height() != INT_MAX;

    // ### set page size to paginated size?
    QMarginsF m = printer->pageLayout().margins(QPageLayout::Millimeter);
    if (!documentPaginated && m.left() == 0. && m.right() == 0. && m.top() == 0. && m.bottom() == 0.) {
        m.setLeft(2);
        m.setRight(2);
        m.setTop(2);
        m.setBottom(2);
        printer->setPageMargins(m, QPageLayout::Millimeter);
    }
    // ### use the margins correctly

    QPainter p(printer);

    // Check that there is a valid device to print to.
    if (!p.isActive())
        return;

    const QTextDocument *doc = this;
    QScopedPointer<QTextDocument> clonedDoc;
    (void)doc->documentLayout(); // make sure that there is a layout

    QRectF body = QRectF(QPointF(0, 0), d->pageSize);
    QPointF pageNumberPos;

    qreal sourceDpiX = qt_defaultDpiX();
    qreal sourceDpiY = qt_defaultDpiY();
    const qreal dpiScaleX = qreal(printer->logicalDpiX()) / sourceDpiX;
    const qreal dpiScaleY = qreal(printer->logicalDpiY()) / sourceDpiY;

    if (documentPaginated) {

        QPaintDevice *dev = doc->documentLayout()->paintDevice();
        if (dev) {
            sourceDpiX = dev->logicalDpiX();
            sourceDpiY = dev->logicalDpiY();
        }

        // scale to dpi
        p.scale(dpiScaleX, dpiScaleY);

        QSizeF scaledPageSize = d->pageSize;
        scaledPageSize.rwidth() *= dpiScaleX;
        scaledPageSize.rheight() *= dpiScaleY;

        const QSizeF printerPageSize(printer->width(), printer->height());

        // scale to page
        p.scale(printerPageSize.width() / scaledPageSize.width(),
                printerPageSize.height() / scaledPageSize.height());
    } else {
        doc = clone(const_cast<QTextDocument *>(this));
        clonedDoc.reset(const_cast<QTextDocument *>(doc));

        for (QTextBlock srcBlock = firstBlock(), dstBlock = clonedDoc->firstBlock();
             srcBlock.isValid() && dstBlock.isValid();
             srcBlock = srcBlock.next(), dstBlock = dstBlock.next()) {
            dstBlock.layout()->setFormats(srcBlock.layout()->formats());
        }

        QAbstractTextDocumentLayout *layout = doc->documentLayout();
        layout->setPaintDevice(p.device());

        // copy the custom object handlers
        layout->d_func()->handlers = documentLayout()->d_func()->handlers;

        // 2 cm margins, scaled to device in QTextDocumentLayoutPrivate::layoutFrame
        const int horizontalMargin = int((2/2.54)*sourceDpiX);
        const int verticalMargin = int((2/2.54)*sourceDpiY);
        QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        fmt.setLeftMargin(horizontalMargin);
        fmt.setRightMargin(horizontalMargin);
        fmt.setTopMargin(verticalMargin);
        fmt.setBottomMargin(verticalMargin);
        doc->rootFrame()->setFrameFormat(fmt);

        // pageNumberPos must be in device coordinates, so scale to device here
        const int dpiy = p.device()->logicalDpiY();
        body = QRectF(0, 0, printer->width(), printer->height());
        pageNumberPos = QPointF(body.width() - horizontalMargin * dpiScaleX,
                                body.height() - verticalMargin * dpiScaleY
                                + QFontMetrics(doc->defaultFont(), p.device()).ascent()
                                + 5 * dpiy / 72.0);
        clonedDoc->setPageSize(body.size());
    }

    const QPageRanges pageRanges = printer->pageRanges();
    int fromPage = pageRanges.firstPage();
    int toPage = pageRanges.lastPage();

    if (fromPage == 0 && toPage == 0) {
        fromPage = 1;
        toPage = doc->pageCount();
    }
    // paranoia check
    fromPage = qMax(1, fromPage);
    toPage = qMin(doc->pageCount(), toPage);

    if (toPage < fromPage) {
        // if the user entered a page range outside the actual number
        // of printable pages, just return
        return;
    }

//    bool ascending = true;
//    if (printer->pageOrder() == QPrinter::LastPageFirst) {
//        int tmp = fromPage;
//        fromPage = toPage;
//        toPage = tmp;
//        ascending = false;
//    }

    int page = fromPage;
    while (true) {
        if (pageRanges.isEmpty() || pageRanges.contains(page))
            printPage(page, &p, doc, body, pageNumberPos);

        if (page == toPage)
            break;
        ++page;
        if (!printer->newPage())
            return;
    }
}